

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPhysicalDeviceRobustness2FeaturesEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPhysicalDeviceRobustness2FeaturesEXT>
          (Impl *this,VkPhysicalDeviceRobustness2FeaturesEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPhysicalDeviceRobustness2FeaturesEXT *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPhysicalDeviceRobustness2FeaturesEXT *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPhysicalDeviceRobustness2FeaturesEXT>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::
      copy<VkPhysicalDeviceRobustness2FeaturesEXT_const*,VkPhysicalDeviceRobustness2FeaturesEXT*>
                (src,src + count,(VkPhysicalDeviceRobustness2FeaturesEXT *)this_local);
    }
  }
  return (VkPhysicalDeviceRobustness2FeaturesEXT *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}